

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qauthenticator.cpp
# Opt level: O0

gss_name_t qGSsapiGetServiceName(QStringView host)

{
  int iVar1;
  long in_FS_OFFSET;
  OM_uint32 majStat;
  OM_uint32 minStat;
  gss_name_t importedName;
  gss_buffer_desc nameDesc;
  QByteArray serviceName;
  OM_uint32 in_stack_ffffffffffffff58;
  OM_uint32 in_stack_ffffffffffffff5c;
  QStringView *in_stack_ffffffffffffff60;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  gss_name_t local_90;
  undefined4 local_84;
  gss_name_t local_80;
  qsizetype local_78;
  char *local_70;
  QByteArray local_30;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_30.d.d = (Data *)0xaaaaaaaaaaaaaaaa;
  local_30.d.ptr = (char *)0xaaaaaaaaaaaaaaaa;
  local_30.d.size = -0x5555555555555556;
  QStringView::toLocal8Bit(in_stack_ffffffffffffff60);
  operator+((char (*) [7])CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
            (QByteArray *)in_stack_ffffffffffffff60);
  QStringBuilder::operator_cast_to_QByteArray
            ((QStringBuilder<const_char_(&)[7],_QByteArray> *)
             CONCAT44(in_stack_ffffffffffffff5c,in_stack_ffffffffffffff58));
  QStringBuilder<const_char_(&)[7],_QByteArray>::~QStringBuilder
            ((QStringBuilder<const_char_(&)[7],_QByteArray> *)0x20b1d3);
  QByteArray::~QByteArray((QByteArray *)0x20b1dd);
  local_78 = -0x5555555555555556;
  local_70 = (char *)0xaaaaaaaaaaaaaaaa;
  local_78 = QByteArray::size(&local_30);
  local_70 = QByteArray::data((QByteArray *)in_stack_ffffffffffffff60);
  local_80 = (gss_name_t)0xaaaaaaaaaaaaaaaa;
  local_84 = 0xaaaaaaaa;
  iVar1 = gss_import_name(&local_84,&local_78,_GSS_C_NT_HOSTBASED_SERVICE,&local_80);
  if (iVar1 == 0) {
    local_90 = local_80;
  }
  else {
    q_GSSAPI_error((char *)in_stack_ffffffffffffff60,in_stack_ffffffffffffff5c,
                   in_stack_ffffffffffffff58);
    local_90 = (gss_name_t)0x0;
  }
  QByteArray::~QByteArray((QByteArray *)0x20b296);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return local_90;
  }
  __stack_chk_fail();
}

Assistant:

static gss_name_t qGSsapiGetServiceName(QStringView host)
{
    QByteArray serviceName = "HTTPS@" + host.toLocal8Bit();
    gss_buffer_desc nameDesc = {static_cast<std::size_t>(serviceName.size()), serviceName.data()};

    gss_name_t importedName;
    OM_uint32 minStat;
    OM_uint32 majStat = gss_import_name(&minStat, &nameDesc,
                              GSS_C_NT_HOSTBASED_SERVICE, &importedName);

    if (majStat != GSS_S_COMPLETE) {
        q_GSSAPI_error("gss_import_name error", majStat, minStat);
        return nullptr;
    }
    return importedName;
}